

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  value_type pVVar1;
  bool bVar2;
  options_description_easy_init *poVar3;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar4;
  options_description *poVar5;
  size_type sVar6;
  ostream *poVar7;
  basic_command_line_parser<char> *filePath;
  basic_command_line_parser<char> *data_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  size_t sVar9;
  string *psVar10;
  VolumeFile *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  iterator ppVVar12;
  bool bVar13;
  exception *e;
  value_type vol;
  iterator __end4;
  iterator __begin4;
  array<VolumeFile_*,_3UL> *__range4;
  VolumeFile *volume;
  array<VolumeFile_*,_3UL> volumes;
  GT7VolumeFile vol7;
  GT6VolumeFile vol6;
  GT5VolumeFile vol5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *outDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *inFile_1;
  variables_map restVarMap_1;
  Salsa20Cipher cipher;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  uint8_t key [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *keyStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *outFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *inFile;
  variables_map restVarMap;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  restParams;
  variables_map varMap;
  basic_parsed_options<char> parsedOpts;
  options_description allOpts;
  options_description decryptOpts;
  options_description unpackOpts;
  options_description generalOpts;
  undefined4 in_stack_ffffffffffffe928;
  int in_stack_ffffffffffffe92c;
  GT5VolumeFile *in_stack_ffffffffffffe930;
  key_type *in_stack_ffffffffffffe938;
  Salsa20Cipher *in_stack_ffffffffffffe940;
  undefined7 in_stack_ffffffffffffe958;
  undefined1 in_stack_ffffffffffffe95f;
  basic_command_line_parser<char> *in_stack_ffffffffffffe960;
  char *in_stack_ffffffffffffe968;
  undefined7 in_stack_ffffffffffffe970;
  undefined1 in_stack_ffffffffffffe977;
  collect_unrecognized_mode in_stack_ffffffffffffe984;
  uint uVar14;
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  *in_stack_ffffffffffffe988;
  undefined4 in_stack_ffffffffffffe990;
  undefined1 in_stack_ffffffffffffe994;
  undefined1 in_stack_ffffffffffffe995;
  undefined1 in_stack_ffffffffffffe996;
  byte bVar15;
  undefined1 in_stack_ffffffffffffe997;
  uint8_t *in_stack_ffffffffffffe998;
  basic_command_line_parser<char> *in_stack_ffffffffffffe9a0;
  basic_command_line_parser<char> *in_stack_ffffffffffffe9a8;
  VolumeFile *this_00;
  byte local_1552;
  byte local_1542;
  allocator<char> *dataSize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_01;
  iterator local_1380;
  value_type local_1370;
  allocator<char> local_9c1;
  string local_9c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9a0;
  allocator<char> local_991;
  string local_990 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_970;
  byte local_963;
  byte local_962;
  allocator<char> local_961;
  string local_960 [39];
  allocator<char> local_939;
  string local_938 [152];
  basic_parsed_options local_8a0 [40];
  undefined1 local_878 [167];
  allocator<char> local_7d1;
  string local_7d0 [96];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_770;
  byte local_751;
  byte local_709;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  allocator<char> local_699;
  string local_698 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_678;
  allocator<char> local_669;
  string local_668 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_648;
  allocator<char> local_639;
  string local_638 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_618;
  int local_610;
  byte local_60b;
  byte local_60a;
  allocator<char> local_609;
  string local_608 [37];
  byte local_5e3;
  byte local_5e2;
  allocator<char> local_5e1;
  string local_5e0 [39];
  allocator<char> local_5b9;
  string local_5b8 [152];
  basic_parsed_options local_520 [40];
  variables_map local_4f8;
  undefined1 local_451 [40];
  allocator<char> local_429;
  string local_428 [56];
  undefined1 local_3f0 [280];
  basic_parsed_options local_2d8 [40];
  options_description local_2b0;
  options_description_easy_init local_230;
  allocator<char> local_221;
  string local_220 [32];
  options_description local_200;
  options_description_easy_init local_180;
  allocator<char> local_171;
  string local_170 [32];
  options_description local_150;
  options_description_easy_init local_d0 [3];
  allocator<char> local_b1;
  string local_b0 [32];
  options_description local_90;
  int local_4;
  
  local_4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe977,in_stack_ffffffffffffe970),in_stack_ffffffffffffe968
             ,(allocator<char> *)in_stack_ffffffffffffe960);
  boost::program_options::options_description::options_description(&local_90,local_b0,0x50,0x28);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  local_d0[0].owner =
       (options_description *)boost::program_options::options_description::add_options(&local_90);
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (local_d0,"help,h","Display help message");
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar3,"unpack,u","Unpack volume files");
  boost::program_options::options_description_easy_init::operator()
            (poVar3,"decrypt,d","Decrypt file");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe977,in_stack_ffffffffffffe970),in_stack_ffffffffffffe968
             ,(allocator<char> *)in_stack_ffffffffffffe960);
  boost::program_options::options_description::options_description(&local_150,local_170,0x50,0x28);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  local_180.owner =
       (options_description *)boost::program_options::options_description::add_options(&local_150);
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (&local_180,"input,i",(value_semantic *)ptVar4,"Volume/Index file");
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  boost::program_options::options_description_easy_init::operator()
            (poVar3,"output,o",(value_semantic *)ptVar4,"Output directory");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe977,in_stack_ffffffffffffe970),in_stack_ffffffffffffe968
             ,(allocator<char> *)in_stack_ffffffffffffe960);
  boost::program_options::options_description::options_description(&local_200,local_220,0x50,0x28);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  local_230.owner =
       (options_description *)boost::program_options::options_description::add_options(&local_200);
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (&local_230,"input,i",(value_semantic *)ptVar4,"Input file");
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar3,"output,o",(value_semantic *)ptVar4,"Output file");
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  boost::program_options::options_description_easy_init::operator()
            (poVar3,"key,k",(value_semantic *)ptVar4,"Encryption key");
  boost::program_options::options_description::options_description(&local_2b0,0x50,0x28);
  poVar5 = (options_description *)
           boost::program_options::options_description::add(&local_2b0,&local_90);
  poVar5 = (options_description *)
           boost::program_options::options_description::add(poVar5,&local_150);
  boost::program_options::options_description::add(poVar5,&local_200);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            (in_stack_ffffffffffffe9a0,(int)((ulong)in_stack_ffffffffffffe998 >> 0x20),
             (char **)CONCAT17(in_stack_ffffffffffffe997,
                               CONCAT16(in_stack_ffffffffffffe996,
                                        CONCAT15(in_stack_ffffffffffffe995,
                                                 CONCAT14(in_stack_ffffffffffffe994,
                                                          in_stack_ffffffffffffe990)))));
  boost::program_options::basic_command_line_parser<char>::style
            ((basic_command_line_parser<char> *)in_stack_ffffffffffffe930,in_stack_ffffffffffffe92c)
  ;
  boost::program_options::basic_command_line_parser<char>::allow_unregistered
            ((basic_command_line_parser<char> *)in_stack_ffffffffffffe930);
  boost::program_options::basic_command_line_parser<char>::options
            ((basic_command_line_parser<char> *)in_stack_ffffffffffffe930,
             (options_description *)CONCAT44(in_stack_ffffffffffffe92c,in_stack_ffffffffffffe928));
  boost::program_options::basic_command_line_parser<char>::run(in_stack_ffffffffffffe9a8);
  boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser
            ((basic_command_line_parser<char> *)0x128271);
  boost::program_options::variables_map::variables_map((variables_map *)local_3f0);
  boost::program_options::store(local_2d8,(variables_map *)local_3f0,false);
  boost::program_options::collect_unrecognized<char>
            (in_stack_ffffffffffffe988,in_stack_ffffffffffffe984);
  boost::program_options::notify((variables_map *)local_3f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe977,in_stack_ffffffffffffe970),in_stack_ffffffffffffe968
             ,(allocator<char> *)in_stack_ffffffffffffe960);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)in_stack_ffffffffffffe940,in_stack_ffffffffffffe938);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator(&local_429);
  if (sVar6 == 0) {
    data_01 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_3f0 + 0x10);
    psVar10 = (string *)local_451;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe977,in_stack_ffffffffffffe970),
               in_stack_ffffffffffffe968,(allocator<char> *)in_stack_ffffffffffffe960);
    sVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)in_stack_ffffffffffffe940,in_stack_ffffffffffffe938);
    std::__cxx11::string::~string((string *)(local_451 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_451);
    if (sVar6 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe977,in_stack_ffffffffffffe970),
                 in_stack_ffffffffffffe968,(allocator<char> *)in_stack_ffffffffffffe960);
      sVar6 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       *)in_stack_ffffffffffffe940,in_stack_ffffffffffffe938);
      std::__cxx11::string::~string(local_7d0);
      std::allocator<char>::~allocator(&local_7d1);
      if (sVar6 == 0) goto LAB_00128351;
      boost::program_options::variables_map::variables_map((variables_map *)local_878);
      boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
                (in_stack_ffffffffffffe960,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffe95f,in_stack_ffffffffffffe958));
      boost::program_options::basic_command_line_parser<char>::style
                ((basic_command_line_parser<char> *)in_stack_ffffffffffffe930,
                 in_stack_ffffffffffffe92c);
      boost::program_options::basic_command_line_parser<char>::allow_unregistered
                ((basic_command_line_parser<char> *)in_stack_ffffffffffffe930);
      boost::program_options::basic_command_line_parser<char>::options
                ((basic_command_line_parser<char> *)in_stack_ffffffffffffe930,
                 (options_description *)
                 CONCAT44(in_stack_ffffffffffffe92c,in_stack_ffffffffffffe928));
      boost::program_options::basic_command_line_parser<char>::run(in_stack_ffffffffffffe9a8);
      boost::program_options::store(local_8a0,(variables_map *)local_878,false);
      boost::program_options::basic_parsed_options<char>::~basic_parsed_options
                ((basic_parsed_options<char> *)0x12951c);
      boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser
                ((basic_command_line_parser<char> *)0x129529);
      boost::program_options::notify((variables_map *)local_878);
      this_00 = (VolumeFile *)(local_878 + 0x10);
      std::allocator<char>::allocator();
      local_962 = 0;
      local_963 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe977,in_stack_ffffffffffffe970),
                 in_stack_ffffffffffffe968,(allocator<char> *)in_stack_ffffffffffffe960);
      psVar10 = (string *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                         *)in_stack_ffffffffffffe940,in_stack_ffffffffffffe938);
      bVar13 = true;
      if (psVar10 != (string *)0x0) {
        std::allocator<char>::allocator();
        local_962 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffe977,in_stack_ffffffffffffe970),
                   in_stack_ffffffffffffe968,(allocator<char> *)in_stack_ffffffffffffe960);
        local_963 = 1;
        sVar6 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                         *)in_stack_ffffffffffffe940,in_stack_ffffffffffffe938);
        bVar13 = sVar6 == 0;
      }
      if ((local_963 & 1) != 0) {
        std::__cxx11::string::~string(local_960);
      }
      if ((local_962 & 1) != 0) {
        std::allocator<char>::~allocator(&local_961);
      }
      std::__cxx11::string::~string(local_938);
      std::allocator<char>::~allocator(&local_939);
      if (bVar13) {
        local_610 = 2;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffe977,in_stack_ffffffffffffe970),
                   in_stack_ffffffffffffe968,(allocator<char> *)in_stack_ffffffffffffe960);
        this = (VolumeFile *)
               boost::program_options::variables_map::operator[]
                         ((variables_map *)in_stack_ffffffffffffe930,
                          (string *)CONCAT44(in_stack_ffffffffffffe92c,in_stack_ffffffffffffe928));
        pbVar8 = boost::program_options::variable_value::as<std::__cxx11::string>
                           ((variable_value *)0x129881);
        std::__cxx11::string::~string(local_990);
        std::allocator<char>::~allocator(&local_991);
        local_970 = pbVar8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffe977,in_stack_ffffffffffffe970),
                   in_stack_ffffffffffffe968,(allocator<char> *)in_stack_ffffffffffffe960);
        boost::program_options::variables_map::operator[]
                  ((variables_map *)in_stack_ffffffffffffe930,
                   (string *)CONCAT44(in_stack_ffffffffffffe92c,in_stack_ffffffffffffe928));
        pbVar11 = boost::program_options::variable_value::as<std::__cxx11::string>
                            ((variable_value *)0x12990e);
        std::__cxx11::string::~string(local_9c0);
        std::allocator<char>::~allocator(&local_9c1);
        local_9a0 = pbVar11;
        boost::filesystem::path::path
                  ((path *)in_stack_ffffffffffffe930,
                   (string_type *)CONCAT44(in_stack_ffffffffffffe92c,in_stack_ffffffffffffe928));
        bVar13 = boost::filesystem::exists((path *)in_stack_ffffffffffffe930);
        bVar15 = 1;
        if (bVar13) {
          boost::filesystem::path::path
                    ((path *)in_stack_ffffffffffffe930,
                     (string_type *)CONCAT44(in_stack_ffffffffffffe92c,in_stack_ffffffffffffe928));
          bVar13 = boost::filesystem::is_regular_file((path *)in_stack_ffffffffffffe930);
          bVar15 = bVar13 ^ 0xff;
          boost::filesystem::path::~path((path *)0x1299dc);
        }
        boost::filesystem::path::~path((path *)0x1299e9);
        if ((bVar15 & 1) == 0) {
          boost::filesystem::path::path
                    ((path *)in_stack_ffffffffffffe930,
                     (string_type *)CONCAT44(in_stack_ffffffffffffe92c,in_stack_ffffffffffffe928));
          bVar13 = boost::filesystem::exists((path *)in_stack_ffffffffffffe930);
          bVar15 = 0;
          if (bVar13) {
            boost::filesystem::path::path
                      ((path *)in_stack_ffffffffffffe930,
                       (string_type *)CONCAT44(in_stack_ffffffffffffe92c,in_stack_ffffffffffffe928))
            ;
            bVar2 = boost::filesystem::is_directory((path *)in_stack_ffffffffffffe930);
            bVar15 = bVar2 ^ 0xff;
          }
          uVar14 = (uint)bVar15;
          if (bVar13) {
            boost::filesystem::path::~path((path *)0x129bc7);
          }
          boost::filesystem::path::~path((path *)0x129bd4);
          if ((uVar14 & 1) == 0) {
            GT5VolumeFile::GT5VolumeFile(in_stack_ffffffffffffe930);
            GT6VolumeFile::GT6VolumeFile((GT6VolumeFile *)in_stack_ffffffffffffe930);
            GT7VolumeFile::GT7VolumeFile((GT7VolumeFile *)in_stack_ffffffffffffe930);
            local_1370 = (value_type)0x0;
            local_1380 = std::array<VolumeFile_*,_3UL>::begin((array<VolumeFile_*,_3UL> *)0x129d06);
            ppVVar12 = std::array<VolumeFile_*,_3UL>::end((array<VolumeFile_*,_3UL> *)0x129d1b);
            for (; pVVar1 = local_1370, local_1380 != ppVVar12; local_1380 = local_1380 + 1) {
              pVVar1 = *local_1380;
              bVar13 = VolumeFile::load(this_00,psVar10);
              if (bVar13) break;
            }
            local_1370 = pVVar1;
            if (local_1370 == (value_type)0x0) {
              poVar7 = std::operator<<((ostream *)&std::cerr,"Unable to load volume file.");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              local_4 = 1;
            }
            else {
              poVar7 = std::operator<<((ostream *)&std::cout,"Unpacking files...");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              bVar13 = VolumeFile::unpackAll(this,pbVar8);
              if (bVar13) {
                poVar7 = std::operator<<((ostream *)&std::cout,"Done!");
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                local_4 = 0;
              }
              else {
                poVar7 = std::operator<<((ostream *)&std::cerr,"Unable to unpack volume file.");
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                local_4 = 1;
              }
            }
            local_610 = 1;
            GT7VolumeFile::~GT7VolumeFile((GT7VolumeFile *)in_stack_ffffffffffffe930);
            GT6VolumeFile::~GT6VolumeFile((GT6VolumeFile *)0x129f3d);
            GT5VolumeFile::~GT5VolumeFile(in_stack_ffffffffffffe930);
          }
          else {
            poVar7 = std::operator<<((ostream *)&std::cerr,"Invalid output directory specified.");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            local_4 = 1;
            local_610 = 1;
          }
        }
        else {
          poVar7 = std::operator<<((ostream *)&std::cerr,"Invalid volume file specified.");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          local_4 = 1;
          local_610 = 1;
        }
      }
      boost::program_options::variables_map::~variables_map
                ((variables_map *)in_stack_ffffffffffffe930);
    }
    else {
      boost::program_options::variables_map::variables_map(&local_4f8);
      boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
                (in_stack_ffffffffffffe960,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffe95f,in_stack_ffffffffffffe958));
      boost::program_options::basic_command_line_parser<char>::style
                ((basic_command_line_parser<char> *)in_stack_ffffffffffffe930,
                 in_stack_ffffffffffffe92c);
      filePath = boost::program_options::basic_command_line_parser<char>::allow_unregistered
                           ((basic_command_line_parser<char> *)in_stack_ffffffffffffe930);
      data_00 = boost::program_options::basic_command_line_parser<char>::options
                          ((basic_command_line_parser<char> *)in_stack_ffffffffffffe930,
                           (options_description *)
                           CONCAT44(in_stack_ffffffffffffe92c,in_stack_ffffffffffffe928));
      boost::program_options::basic_command_line_parser<char>::run(in_stack_ffffffffffffe9a8);
      boost::program_options::store(local_520,&local_4f8,false);
      boost::program_options::basic_parsed_options<char>::~basic_parsed_options
                ((basic_parsed_options<char> *)0x1286db);
      boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser
                ((basic_command_line_parser<char> *)0x1286e8);
      boost::program_options::notify(&local_4f8);
      dataSize = &local_5b9;
      std::allocator<char>::allocator();
      local_5e2 = 0;
      local_5e3 = 0;
      local_60a = 0;
      local_60b = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe977,in_stack_ffffffffffffe970),
                 in_stack_ffffffffffffe968,(allocator<char> *)in_stack_ffffffffffffe960);
      sVar6 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       *)in_stack_ffffffffffffe940,in_stack_ffffffffffffe938);
      bVar13 = true;
      if (sVar6 != 0) {
        std::allocator<char>::allocator();
        local_5e2 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffe977,in_stack_ffffffffffffe970),
                   in_stack_ffffffffffffe968,(allocator<char> *)in_stack_ffffffffffffe960);
        local_5e3 = 1;
        sVar6 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                         *)in_stack_ffffffffffffe940,in_stack_ffffffffffffe938);
        bVar13 = true;
        if (sVar6 != 0) {
          std::allocator<char>::allocator();
          local_60a = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffe977,in_stack_ffffffffffffe970),
                     in_stack_ffffffffffffe968,(allocator<char> *)in_stack_ffffffffffffe960);
          local_60b = 1;
          sVar6 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                           *)in_stack_ffffffffffffe940,in_stack_ffffffffffffe938);
          bVar13 = sVar6 == 0;
        }
      }
      if ((local_60b & 1) != 0) {
        std::__cxx11::string::~string(local_608);
      }
      if ((local_60a & 1) != 0) {
        std::allocator<char>::~allocator(&local_609);
      }
      if ((local_5e3 & 1) != 0) {
        std::__cxx11::string::~string(local_5e0);
      }
      if ((local_5e2 & 1) != 0) {
        std::allocator<char>::~allocator(&local_5e1);
      }
      std::__cxx11::string::~string(local_5b8);
      std::allocator<char>::~allocator(&local_5b9);
      if (bVar13) {
        local_610 = 2;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffe977,in_stack_ffffffffffffe970),
                   in_stack_ffffffffffffe968,(allocator<char> *)in_stack_ffffffffffffe960);
        boost::program_options::variables_map::operator[]
                  ((variables_map *)in_stack_ffffffffffffe930,
                   (string *)CONCAT44(in_stack_ffffffffffffe92c,in_stack_ffffffffffffe928));
        pbVar8 = boost::program_options::variable_value::as<std::__cxx11::string>
                           ((variable_value *)0x128b77);
        std::__cxx11::string::~string(local_638);
        std::allocator<char>::~allocator(&local_639);
        local_618 = pbVar8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffe977,in_stack_ffffffffffffe970),
                   in_stack_ffffffffffffe968,(allocator<char> *)in_stack_ffffffffffffe960);
        boost::program_options::variables_map::operator[]
                  ((variables_map *)in_stack_ffffffffffffe930,
                   (string *)CONCAT44(in_stack_ffffffffffffe92c,in_stack_ffffffffffffe928));
        pbVar8 = boost::program_options::variable_value::as<std::__cxx11::string>
                           ((variable_value *)0x128c0a);
        std::__cxx11::string::~string(local_668);
        std::allocator<char>::~allocator(&local_669);
        local_648 = pbVar8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffe977,in_stack_ffffffffffffe970),
                   in_stack_ffffffffffffe968,(allocator<char> *)in_stack_ffffffffffffe960);
        boost::program_options::variables_map::operator[]
                  ((variables_map *)in_stack_ffffffffffffe930,
                   (string *)CONCAT44(in_stack_ffffffffffffe92c,in_stack_ffffffffffffe928));
        pbVar8 = boost::program_options::variable_value::as<std::__cxx11::string>
                           ((variable_value *)0x128c9d);
        std::__cxx11::string::~string(local_698);
        std::allocator<char>::~allocator(&local_699);
        local_6c8 = 0;
        uStack_6c0 = 0;
        uStack_6b8 = 0;
        uStack_6b0 = 0;
        local_678 = pbVar8;
        sVar9 = parseHexString((string *)in_stack_ffffffffffffe930,
                               (uint8_t *)
                               CONCAT44(in_stack_ffffffffffffe92c,in_stack_ffffffffffffe928),
                               0x128cfb);
        if (sVar9 == 0x20) {
          local_709 = 0;
          boost::filesystem::path::path
                    ((path *)in_stack_ffffffffffffe930,
                     (string_type *)CONCAT44(in_stack_ffffffffffffe92c,in_stack_ffffffffffffe928));
          bVar13 = boost::filesystem::exists((path *)in_stack_ffffffffffffe930);
          local_1542 = 1;
          if (bVar13) {
            boost::filesystem::path::path
                      ((path *)in_stack_ffffffffffffe930,
                       (string_type *)CONCAT44(in_stack_ffffffffffffe92c,in_stack_ffffffffffffe928))
            ;
            local_709 = 1;
            bVar13 = boost::filesystem::is_regular_file((path *)in_stack_ffffffffffffe930);
            local_1542 = bVar13 ^ 0xff;
          }
          if ((local_709 & 1) != 0) {
            boost::filesystem::path::~path((path *)0x128ef8);
          }
          boost::filesystem::path::~path((path *)0x128f05);
          if ((local_1542 & 1) == 0) {
            local_751 = 0;
            boost::filesystem::path::path
                      ((path *)in_stack_ffffffffffffe930,
                       (string_type *)CONCAT44(in_stack_ffffffffffffe92c,in_stack_ffffffffffffe928))
            ;
            bVar13 = boost::filesystem::exists((path *)in_stack_ffffffffffffe930);
            local_1552 = 0;
            if (bVar13) {
              boost::filesystem::path::path
                        ((path *)in_stack_ffffffffffffe930,
                         (string_type *)
                         CONCAT44(in_stack_ffffffffffffe92c,in_stack_ffffffffffffe928));
              local_751 = 1;
              bVar13 = boost::filesystem::is_regular_file((path *)in_stack_ffffffffffffe930);
              local_1552 = bVar13 ^ 0xff;
            }
            if ((local_751 & 1) != 0) {
              boost::filesystem::path::~path((path *)0x129072);
            }
            boost::filesystem::path::~path((path *)0x12907f);
            if ((local_1552 & 1) == 0) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x129149);
              bVar13 = loadFromFile(psVar10,data_01);
              if (bVar13) {
                poVar7 = std::operator<<((ostream *)&std::cout,"Decrypting file...");
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                Salsa20Cipher::Salsa20Cipher
                          (in_stack_ffffffffffffe940,(uint8_t *)in_stack_ffffffffffffe938,
                           (size_t)in_stack_ffffffffffffe930,
                           (uint8_t *)CONCAT44(in_stack_ffffffffffffe92c,in_stack_ffffffffffffe928))
                ;
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x129250);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x129265);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_770);
                Salsa20Cipher::processBytes
                          ((Salsa20Cipher *)in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998,
                           (uint8_t *)
                           CONCAT17(in_stack_ffffffffffffe997,
                                    CONCAT16(in_stack_ffffffffffffe996,
                                             CONCAT15(in_stack_ffffffffffffe995,
                                                      CONCAT14(in_stack_ffffffffffffe994,
                                                               in_stack_ffffffffffffe990)))),
                           (size_t)in_stack_ffffffffffffe988);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1292c1);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_770);
                bVar13 = saveToFile((string *)filePath,data_00,(size_t)dataSize);
                if (bVar13) {
                  poVar7 = std::operator<<((ostream *)&std::cout,"Done!");
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  local_4 = 0;
                }
                else {
                  poVar7 = std::operator<<((ostream *)&std::cerr,"Unable to load input file.");
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  local_4 = 1;
                }
              }
              else {
                poVar7 = std::operator<<((ostream *)&std::cerr,"Unable to load input file.");
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                local_4 = 1;
              }
              local_610 = 1;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_ffffffffffffe940);
            }
            else {
              poVar7 = std::operator<<((ostream *)&std::cerr,"Invalid output file specified.");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              local_4 = 1;
              local_610 = 1;
            }
          }
          else {
            poVar7 = std::operator<<((ostream *)&std::cerr,"Invalid input file specified.");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            local_4 = 1;
            local_610 = 1;
          }
        }
        else {
          poVar7 = std::operator<<((ostream *)&std::cerr,"Invalid key specified.");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          local_4 = 1;
          local_610 = 1;
        }
      }
      boost::program_options::variables_map::~variables_map
                ((variables_map *)in_stack_ffffffffffffe930);
    }
    if (local_610 != 2) goto LAB_00129fa9;
  }
LAB_00128351:
  poVar7 = std::operator<<((ostream *)&std::cout,"GT Tool (c) flatz, 2018");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  boost::program_options::operator<<((ostream *)&std::cout,&local_2b0);
  local_610 = 0;
LAB_00129fa9:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffe940);
  boost::program_options::variables_map::~variables_map((variables_map *)in_stack_ffffffffffffe930);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options
            ((basic_parsed_options<char> *)0x129fd0);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_ffffffffffffe930);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_ffffffffffffe930);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_ffffffffffffe930);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_ffffffffffffe930);
  if (local_610 == 0) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc, const char* argv[])
{
	try {
		boost::program_options::options_description generalOpts("General options");
		generalOpts.add_options()
			("help,h", "Display help message")
			("unpack,u", "Unpack volume files")
			("decrypt,d", "Decrypt file")
		;

		boost::program_options::options_description unpackOpts("Unpack options");
		unpackOpts.add_options()
			("input,i", boost::program_options::value<std::string>(), "Volume/Index file")
			("output,o", boost::program_options::value<std::string>(), "Output directory")
		;

		boost::program_options::options_description decryptOpts("Decrypt options");
		decryptOpts.add_options()
			("input,i", boost::program_options::value<std::string>(), "Input file")
			("output,o", boost::program_options::value<std::string>(), "Output file")
			("key,k", boost::program_options::value<std::string>(), "Encryption key")
		;

		boost::program_options::options_description allOpts;
		allOpts.add(generalOpts).add(unpackOpts).add(decryptOpts);

		auto parsedOpts = boost::program_options::command_line_parser(argc, argv)
			.style(boost::program_options::command_line_style::unix_style)
			.allow_unregistered()
			.options(generalOpts)
			.run();

		boost::program_options::variables_map varMap;
		boost::program_options::store(parsedOpts, varMap);
		const auto restParams = boost::program_options::collect_unrecognized(parsedOpts.options, boost::program_options::include_positional);
		boost::program_options::notify(varMap);

		if (varMap.count("help")) {
show_help:
			std::cout << "GT Tool (c) flatz, 2018" << std::endl;
			std::cout << allOpts;
		} else if (varMap.count("decrypt")) {
			boost::program_options::variables_map restVarMap;
			boost::program_options::store(
				boost::program_options::command_line_parser(restParams)
					.style(boost::program_options::command_line_style::unix_style)
					.allow_unregistered()
					.options(decryptOpts)
					.run(),
				restVarMap
			);
			boost::program_options::notify(restVarMap);

			if (!restVarMap.count("input") || !restVarMap.count("output") || !restVarMap.count("key")) {
				goto show_help;
			}

			const auto& inFile = restVarMap["input"].as<std::string>();
			const auto& outFile = restVarMap["output"].as<std::string>();
			const auto& keyStr = restVarMap["key"].as<std::string>();

			uint8_t key[0x20] = {};
			if (parseHexString(keyStr, key, sizeof(key)) != sizeof(key)) {
				std::cerr << "Invalid key specified." << std::endl;
				return EXIT_FAILURE;
			}

			if (!boost::filesystem::exists(inFile) || !boost::filesystem::is_regular_file(inFile)) {
				std::cerr << "Invalid input file specified." << std::endl;
				return EXIT_FAILURE;
			}
			if (boost::filesystem::exists(outFile) && !boost::filesystem::is_regular_file(outFile)) {
				std::cerr << "Invalid output file specified." << std::endl;
				return EXIT_FAILURE;
			}

			std::vector<uint8_t> data;
			if (!loadFromFile(inFile, data)) {
				std::cerr << "Unable to load input file." << std::endl;
				return EXIT_FAILURE;
			}

			std::cout << "Decrypting file..." << std::endl;

			Salsa20Cipher cipher(key, sizeof(key));
			cipher.processBytes(data.data(), data.data(), data.size());

			if (!saveToFile(outFile, data.data(), data.size())) {
				std::cerr << "Unable to load input file." << std::endl;
				return EXIT_FAILURE;
			}

			std::cout << "Done!" << std::endl;
			return EXIT_SUCCESS;
		} else if (varMap.count("unpack")) {
			boost::program_options::variables_map restVarMap;
			boost::program_options::store(
				boost::program_options::command_line_parser(restParams)
					.style(boost::program_options::command_line_style::unix_style)
					.allow_unregistered()
					.options(decryptOpts)
					.run(),
				restVarMap
			);
			boost::program_options::notify(restVarMap);

			if (!restVarMap.count("input") || !restVarMap.count("output")) {
				goto show_help;
			}

			const auto& inFile = restVarMap["input"].as<std::string>();
			const auto& outDir = restVarMap["output"].as<std::string>();

			if (!boost::filesystem::exists(inFile) || !boost::filesystem::is_regular_file(inFile)) {
				std::cerr << "Invalid volume file specified." << std::endl;
				return EXIT_FAILURE;
			}
			if (boost::filesystem::exists(outDir) && !boost::filesystem::is_directory(outDir)) {
				std::cerr << "Invalid output directory specified." << std::endl;
				return EXIT_FAILURE;
			}

			GT5VolumeFile vol5;
			GT6VolumeFile vol6;
			GT7VolumeFile vol7;
			std::array<VolumeFile*, 3> volumes = {{ &vol5, &vol6, &vol7 }};
			VolumeFile* volume = nullptr;
			for (auto vol: volumes) {
				if (vol->load(inFile)) {
					volume = vol;
					break;
				}
			}
			if (!volume) {
				std::cerr << "Unable to load volume file." << std::endl;
				return EXIT_FAILURE;
			}

			std::cout << "Unpacking files..." << std::endl;
			if (!volume->unpackAll(outDir)) {
				std::cerr << "Unable to unpack volume file." << std::endl;
				return EXIT_FAILURE;
			}

			std::cout << "Done!" << std::endl;
			return EXIT_SUCCESS;
		} else {
			goto show_help;
		}
	}
	catch (const std::exception& e) {
		std::cerr << "Unhandled error occurred:" << std::endl << e.what() << std::endl;
		return EXIT_FAILURE;
	}

	return 0;
}